

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O1

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseArray<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<true>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericInsituStringStream<rapidjson::UTF8<char>_> *is,VWReaderHandler<true> *handler)

{
  int iVar1;
  undefined4 extraout_var;
  byte *pbVar2;
  _func_int **pp_Var3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  BaseState<true> *pBVar7;
  undefined4 extraout_var_00;
  
  is->src_ = is->src_ + 1;
  pBVar7 = (handler->ctx).current_state;
  iVar1 = (*pBVar7->_vptr_BaseState[8])(pBVar7,handler);
  if ((BaseState<true> *)CONCAT44(extraout_var,iVar1) != (BaseState<true> *)0x0) {
    (handler->ctx).previous_state = (handler->ctx).current_state;
    (handler->ctx).current_state = (BaseState<true> *)CONCAT44(extraout_var,iVar1);
    pbVar2 = (byte *)is->src_;
    while (((ulong)*pbVar2 < 0x21 && ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) != 0))) {
      pbVar2 = pbVar2 + 1;
    }
    is->src_ = (Ch *)pbVar2;
    if (*(int *)(this + 0x30) != 0) {
      return;
    }
    if (*pbVar2 == 0x5d) {
      is->src_ = (Ch *)(pbVar2 + 1);
      pBVar7 = (handler->ctx).current_state;
      pp_Var3 = pBVar7->_vptr_BaseState;
      uVar5 = 0;
    }
    else {
      uVar6 = 0;
      while( true ) {
        ParseValue<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<true>>
                  (this,is,handler);
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        pbVar2 = (byte *)is->src_;
        while (((ulong)*pbVar2 < 0x21 && ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) != 0))) {
          pbVar2 = pbVar2 + 1;
        }
        is->src_ = (Ch *)pbVar2;
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        uVar6 = uVar6 + 1;
        if (*pbVar2 != 0x2c) break;
        pbVar2 = pbVar2 + 1;
        is->src_ = (Ch *)pbVar2;
        while (((ulong)*pbVar2 < 0x21 && ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) != 0))) {
          pbVar2 = pbVar2 + 1;
        }
        is->src_ = (Ch *)pbVar2;
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
      }
      if (*is->src_ != ']') {
        lVar4 = (long)is->src_ - (long)is->head_;
        *(undefined4 *)(this + 0x30) = 7;
        goto LAB_00128925;
      }
      is->src_ = is->src_ + 1;
      pBVar7 = (handler->ctx).current_state;
      pp_Var3 = pBVar7->_vptr_BaseState;
      uVar5 = (ulong)uVar6;
    }
    iVar1 = (*pp_Var3[9])(pBVar7,handler,uVar5);
    if ((BaseState<true> *)CONCAT44(extraout_var_00,iVar1) != (BaseState<true> *)0x0) {
      (handler->ctx).previous_state = (handler->ctx).current_state;
      (handler->ctx).current_state = (BaseState<true> *)CONCAT44(extraout_var_00,iVar1);
      return;
    }
  }
  lVar4 = (long)is->src_ - (long)is->head_;
  *(undefined4 *)(this + 0x30) = 0x10;
LAB_00128925:
  *(long *)(this + 0x38) = lVar4;
  return;
}

Assistant:

void ParseArray(InputStream& is, Handler& handler) {
        RAPIDJSON_ASSERT(is.Peek() == '[');
        is.Take();  // Skip '['

        if (RAPIDJSON_UNLIKELY(!handler.StartArray()))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());

        SkipWhitespaceAndComments<parseFlags>(is);
        RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

        if (Consume(is, ']')) {
            if (RAPIDJSON_UNLIKELY(!handler.EndArray(0))) // empty array
                RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
            return;
        }

        for (SizeType elementCount = 0;;) {
            ParseValue<parseFlags>(is, handler);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            ++elementCount;
            SkipWhitespaceAndComments<parseFlags>(is);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            if (Consume(is, ',')) {
                SkipWhitespaceAndComments<parseFlags>(is);
                RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
            }
            else if (Consume(is, ']')) {
                if (RAPIDJSON_UNLIKELY(!handler.EndArray(elementCount)))
                    RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
                return;
            }
            else
                RAPIDJSON_PARSE_ERROR(kParseErrorArrayMissCommaOrSquareBracket, is.Tell());

            if (parseFlags & kParseTrailingCommasFlag) {
                if (is.Peek() == ']') {
                    if (RAPIDJSON_UNLIKELY(!handler.EndArray(elementCount)))
                        RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
                    is.Take();
                    return;
                }
            }
        }
    }